

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fromucs.c
# Opt level: O2

void charset_emit(void *ctx,long output)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  char outval;
  
  if (output == 0xffff) {
    pcVar3 = *(char **)((long)ctx + 0x10);
    iVar4 = *(int *)((long)ctx + 0x18);
  }
  else {
    pcVar3 = &outval;
    outval = (char)output;
    iVar4 = 1;
  }
  if (*(int *)((long)ctx + 8) < iVar4) {
    *(undefined4 *)((long)ctx + 0x1c) = 1;
  }
  else {
    for (; 0 < iVar4; iVar4 = iVar4 + -1) {
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
      pcVar2 = *ctx;
      *(char **)ctx = pcVar2 + 1;
      *pcVar2 = cVar1;
      *(int *)((long)ctx + 8) = *(int *)((long)ctx + 8) + -1;
    }
  }
  return;
}

Assistant:

static void charset_emit(void *ctx, long int output)
{
    struct charset_emit_param *param = (struct charset_emit_param *)ctx;
    char outval;
    char const *p;
    int outlen;

    if (output == ERROR) {
        p = param->errstr;
        outlen = param->errlen;
    } else {
        outval = output;
        p = &outval;
        outlen = 1;
    }

    if (param->outlen >= outlen) {
        while (outlen > 0) {
            *param->output++ = *p++;
            param->outlen--;
            outlen--;
        }
    } else {
        param->stopped = 1;
    }
}